

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O1

void __thiscall symbols::Env::Env(Env *this,Env *p)

{
  int depth_prev;
  
  (this->table)._M_h._M_buckets = &(this->table)._M_h._M_single_bucket;
  (this->table)._M_h._M_bucket_count = 1;
  (this->table)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->table)._M_h._M_element_count = 0;
  (this->table)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->table)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->table)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->prev = p;
  this->depth = 1;
  if (p == (Env *)0x0) {
    depth_prev = -1;
  }
  else {
    depth_prev = p->depth;
  }
  setDepth(this,depth_prev);
  return;
}

Assistant:

Env(Env* p)
        :prev{p}
    {
        if(prev != nullptr)
            setDepth(prev->depth);
        else
            setDepth(-1);
    }